

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_linux.cpp
# Opt level: O0

FUNCTION_RETURN
getDiskInfos_blkid(vector<DiskInfo,_std::allocator<DiskInfo>_> *diskInfos,
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *disk_by_uuid)

{
  byte bVar1;
  streambuf *psVar2;
  string local_410;
  int local_3f0;
  undefined1 local_3e0 [8];
  ifstream t;
  char *location;
  stringstream local_1c8 [4];
  int i;
  stringstream buffer;
  undefined1 local_1b8 [383];
  byte local_39;
  char *pcStack_38;
  bool can_read;
  char *strs [2];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *disk_by_uuid_local;
  vector<DiskInfo,_std::allocator<DiskInfo>_> *diskInfos_local;
  
  pcStack_38 = "/run/blkid/blkid.tab";
  strs[0] = "/etc/blkid.tab";
  local_39 = 0;
  std::__cxx11::stringstream::stringstream(local_1c8);
  for (location._4_4_ = 0; location._4_4_ < 2; location._4_4_ = location._4_4_ + 1) {
    std::ifstream::ifstream
              (local_3e0,*(char **)((long)&stack0xffffffffffffffc8 + (long)(int)location._4_4_ * 8),
               _S_in);
    bVar1 = std::ifstream::is_open();
    if ((bVar1 & 1) == 0) {
      local_3f0 = 0;
    }
    else {
      psVar2 = (streambuf *)std::ifstream::rdbuf();
      std::ostream::operator<<(local_1b8,psVar2);
      local_39 = 1;
      local_3f0 = 2;
    }
    std::ifstream::~ifstream(local_3e0);
    if (local_3f0 != 0) break;
  }
  if ((local_39 & 1) == 0) {
    diskInfos_local._4_4_ = FUNC_RET_NOT_AVAIL;
  }
  else {
    std::__cxx11::stringstream::str();
    diskInfos_local._4_4_ = parse_blkid(&local_410,diskInfos,disk_by_uuid);
    std::__cxx11::string::~string((string *)&local_410);
  }
  local_3f0 = 1;
  std::__cxx11::stringstream::~stringstream(local_1c8);
  return diskInfos_local._4_4_;
}

Assistant:

static FUNCTION_RETURN getDiskInfos_blkid(std::vector<DiskInfo> &diskInfos,
										  std::unordered_map<std::string, int> &disk_by_uuid) {
	const char *strs[] = BLKID_LOCATIONS;
	bool can_read = false;
	std::stringstream buffer;
	for (int i = 0; i < sizeof(strs) / sizeof(const char *); i++) {
		const char *location = strs[i];
		std::ifstream t(location);
		if (t.is_open()) {
			buffer << t.rdbuf();
			can_read = true;
			break;
		}
	}
	if (!can_read) {
		return FUNCTION_RETURN::FUNC_RET_NOT_AVAIL;
	}

	return parse_blkid(buffer.str(), diskInfos, disk_by_uuid);
}